

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>*,8ul,void,void>>
::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>*,8ul,void,void>>
           *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *valueMap,Index columnIndex)

{
  uint uVar1;
  reference value;
  node_ptr plVar2;
  node_ptr plVar3;
  pointer puVar4;
  vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
  *this_00;
  ulong uVar5;
  node_ptr next;
  pointer plVar6;
  undefined8 *puVar7;
  long lVar8;
  long local_40;
  long local_38;
  
  if (*(long *)(this + 0x20) != 0) {
    puVar7 = *(undefined8 **)(this + 0x18);
    lVar8 = *(long *)(this + 0x20) << 3;
    do {
      if (puVar7 == (undefined8 *)0x0) {
        __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                      "reference boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, false, true>>> **, false>::operator*() const [Pointer = Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, false, true>>> **, IsConst = false]"
                     );
      }
      value = (reference)*puVar7;
      if ((*(long *)(this + 8) != 0) &&
         (plVar2 = (value->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_,
         plVar2 != (node_ptr)0x0)) {
        plVar3 = (value->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_;
        plVar3->next_ = plVar2;
        plVar2->prev_ = plVar3;
        (value->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
        (value->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
      }
      if (columnIndex != 0xffffffff) {
        (value->super_Entry_column_index_option).columnIndex_ = columnIndex;
      }
      puVar4 = (valueMap->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(valueMap->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 2) <=
          (ulong)value->rowIndex_) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      uVar1 = puVar4[value->rowIndex_];
      value->rowIndex_ = uVar1;
      this_00 = *(vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                  **)(this + 8);
      if (this_00 !=
          (vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
           *)0x0) {
        plVar6 = (this_00->
                 super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this_00->
                          super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)plVar6 >> 4) <
            (ulong)(uVar1 + 1)) {
          std::
          vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
          ::resize(this_00,(ulong)(uVar1 + 1));
          plVar6 = (pointer)**(undefined8 **)(this + 8);
        }
        boost::intrusive::
        list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>::Matrix_row_tag,_1U>,_unsigned_long,_false,_void>
        ::push_back(&plVar6[uVar1].super_type,value);
      }
      puVar7 = puVar7 + 1;
      lVar8 = lVar8 + -8;
    } while (lVar8 != 0);
    uVar5 = *(ulong *)(this + 0x20);
    if (uVar5 != 0) {
      local_38 = *(long *)(this + 0x18);
      local_40 = local_38 + uVar5 * 8;
      lVar8 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      std::
      __introsort_loop<boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>**,false>,long,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>*,8ul,void,void>>::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>(std::vector<unsigned_int,std::allocator<unsigned_int>>const&,unsigned_int)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>const*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>const*)_1_>>
                (&local_38,&local_40,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>**,false>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>*,8ul,void,void>>::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>(std::vector<unsigned_int,std::allocator<unsigned_int>>const&,unsigned_int)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>const*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>const*)_1_>>
                ();
    }
  }
  return;
}

Assistant:

inline void Naive_vector_column<Master_matrix,Support>::reorder(const Row_index_map& valueMap,
                                                        [[maybe_unused]] Index columnIndex)
{
  static_assert(!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type,
                "Method not available for chain columns.");

  for (Entry* entry : column_) {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      RA_opt::unlink(entry);
      if (columnIndex != Master_matrix::template get_null_value<Index>()) entry->set_column_index(columnIndex);
    }
    entry->set_row_index(valueMap.at(entry->get_row_index()));
    if constexpr (Master_matrix::Option_list::has_intrusive_rows && Master_matrix::Option_list::has_row_access)
      RA_opt::insert_entry(entry->get_row_index(), entry);
  }

  // all entries have to be deleted first, to avoid problem with insertion when row is a set
  if constexpr (!Master_matrix::Option_list::has_intrusive_rows && Master_matrix::Option_list::has_row_access) {
    for (Entry* entry : column_) {
      RA_opt::insert_entry(entry->get_row_index(), entry);
    }
  }

  std::sort(column_.begin(), column_.end(), [](const Entry* c1, const Entry* c2) { return *c1 < *c2; });
}